

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

LIBSSH2_AGENT * libssh2_agent_init(LIBSSH2_SESSION *session)

{
  LIBSSH2_AGENT *agent;
  LIBSSH2_SESSION *session_local;
  
  session_local = (LIBSSH2_SESSION *)_libssh2_calloc(session,0x68);
  if (session_local == (LIBSSH2_SESSION *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate space for agent connection");
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    *(undefined4 *)&session_local->alloc = 0xffffffff;
    session_local->abstract = session;
    session_local->send = (_func_ssize_t_libssh2_socket_t_void_ptr_size_t_int_void_ptr_ptr *)0x0;
    _libssh2_list_init((list_head *)&session_local->addLocalIdentities);
  }
  return (LIBSSH2_AGENT *)session_local;
}

Assistant:

LIBSSH2_API LIBSSH2_AGENT *
libssh2_agent_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_AGENT *agent;

    agent = LIBSSH2_CALLOC(session, sizeof(*agent));
    if(!agent) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate space for agent connection");
        return NULL;
    }
    agent->fd = LIBSSH2_INVALID_SOCKET;
    agent->session = session;
    agent->identity_agent_path = NULL;
    _libssh2_list_init(&agent->head);

#ifdef HAVE_WIN32_AGENTS
    agent->pipe = INVALID_HANDLE_VALUE;
    memset(&agent->overlapped, 0, sizeof(OVERLAPPED));
    agent->pending_io = FALSE;
#endif

    return agent;
}